

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O3

void __thiscall Fl_Table::cols(Fl_Table *this,int val)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int *piVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  this->_cols = val;
  uVar1 = (this->_colwidths)._size;
  lVar9 = (long)(int)uVar1;
  if (lVar9 == 0) {
    iVar8 = 0x50;
  }
  else {
    iVar8 = (this->_colwidths).arr[(int)(uVar1 - 1)];
  }
  if (uVar1 != val) {
    piVar5 = (int *)realloc((this->_colwidths).arr,(ulong)(uint)val << 2);
    (this->_colwidths).arr = piVar5;
    (this->_colwidths)._size = val;
  }
  auVar4 = _DAT_00210030;
  auVar3 = _DAT_00210020;
  auVar2 = _DAT_00210010;
  if ((int)uVar1 < val) {
    piVar5 = (this->_colwidths).arr;
    lVar6 = (val - lVar9) + -1;
    auVar10._8_4_ = (int)lVar6;
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar7 = 0;
    auVar10 = auVar10 ^ _DAT_00210030;
    do {
      auVar12._8_4_ = (int)uVar7;
      auVar12._0_8_ = uVar7;
      auVar12._12_4_ = (int)(uVar7 >> 0x20);
      auVar13 = (auVar12 | auVar3) ^ auVar4;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                  iVar11 < auVar13._4_4_) & 1)) {
        piVar5[lVar9 + uVar7] = iVar8;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        piVar5[lVar9 + uVar7 + 1] = iVar8;
      }
      auVar12 = (auVar12 | auVar2) ^ auVar4;
      iVar14 = auVar12._4_4_;
      if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar12._0_4_ <= auVar10._0_4_)) {
        piVar5[lVar9 + uVar7 + 2] = iVar8;
        piVar5[lVar9 + uVar7 + 3] = iVar8;
      }
      uVar7 = uVar7 + 4;
    } while (((val - lVar9) + 3U & 0xfffffffffffffffc) != uVar7);
  }
  table_resized(this);
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Table::cols(int val) {
  _cols = val;
  {
    int default_w = ( _colwidths.size() > 0 ) ? _colwidths[_colwidths.size()-1] : 80;
    int now_size = _colwidths.size();
    _colwidths.size(val);			// enlarge or shrink as needed
    while ( now_size < val ) {
      _colwidths[now_size++] = default_w;	// fill new
    }
  }
  table_resized();
  redraw();
}